

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int archive_compressor_zstd_open(archive_write_filter *f)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  char *fmt;
  archive *a;
  
  piVar1 = (int *)f->data;
  iVar2 = __archive_write_open_filter(f->next_filter);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (*(long *)(piVar1 + 6) == 0) {
    sVar4 = ZSTD_CStreamOutSize();
    sVar6 = sVar4;
    if (f->archive->magic == 0xb0c5c0de) {
      iVar2 = archive_write_get_bytes_per_block(f->archive);
      uVar7 = (ulong)iVar2;
      sVar6 = uVar7;
      if ((uVar7 <= sVar4) && (sVar6 = sVar4, iVar2 != 0)) {
        sVar6 = sVar4 - sVar4 % uVar7;
      }
    }
    *(size_t *)(piVar1 + 8) = sVar6;
    piVar1[10] = 0;
    piVar1[0xb] = 0;
    pvVar5 = malloc(sVar6);
    *(void **)(piVar1 + 6) = pvVar5;
    if (pvVar5 == (void *)0x0) {
      a = f->archive;
      fmt = "Can\'t allocate data for compression buffer";
      iVar2 = 0xc;
      goto LAB_0043b7f6;
    }
  }
  f->write = archive_compressor_zstd_write;
  sVar6 = ZSTD_initCStream(*(ZSTD_CStream **)(piVar1 + 2),*piVar1);
  uVar3 = ZSTD_isError(sVar6);
  if (uVar3 == 0) {
    return 0;
  }
  a = f->archive;
  fmt = "Internal error initializing zstd compressor object";
  iVar2 = -1;
LAB_0043b7f6:
  archive_set_error(a,iVar2,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_zstd_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != ARCHIVE_OK)
		return (ret);

	if (data->out.dst == NULL) {
		size_t bs = ZSTD_CStreamOutSize(), bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of
			 * the of bytes per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->out.size = bs;
		data->out.pos = 0;
		data->out.dst
		    = (unsigned char *)malloc(data->out.size);
		if (data->out.dst == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_zstd_write;

	if (ZSTD_isError(ZSTD_initCStream(data->cstream,
	    data->compression_level))) {
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing zstd compressor object");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}